

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Token * __thiscall Parser::compareOp(Token *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_51;
  string local_50;
  undefined1 local_19;
  Parser *local_18;
  Parser *this_local;
  Token *compOp;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  Tokenizer::getToken(__return_storage_ptr__,this->tokenizer);
  bVar1 = Token::isComparisonOperator(__return_storage_ptr__);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Parser::compareOp",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Expected comparison operator, instead got",&local_79);
    die(this,&local_50,&local_78,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Parser::compareOp() {
    // comp_op:  < > == >= <= <> !=

    Token compOp = tokenizer.getToken();
    if(!compOp.isComparisonOperator())
        die("Parser::compareOp", "Expected comparison operator, instead got", compOp);
    return compOp;
}